

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

char * downlevel(char *filename)

{
  size_t sVar1;
  int local_14;
  int flen;
  int len;
  char *filename_local;
  
  if (pathname == (char *)0x0) {
    local_14 = 0;
  }
  else {
    sVar1 = strlen(pathname);
    local_14 = (int)sVar1;
  }
  sVar1 = strlen(filename);
  if (local_14 == 0) {
    pathname = (char *)malloc((long)((int)sVar1 + 1));
    if (pathname != (char *)0x0) {
      strcpy(pathname,filename);
    }
  }
  else {
    pathname = (char *)realloc(pathname,(long)(local_14 + (int)sVar1 + 2));
    if (pathname != (char *)0x0) {
      strcat(pathname,"/");
      strcat(pathname,filename);
    }
  }
  return pathname;
}

Assistant:

char *
downlevel(char *filename)
{
	register int len, flen;

	if (!pathname)
		len = 0;
	else
		len = strlen(pathname);

	flen = strlen(filename);
	if (!len)
	{
		pathname = malloc(flen + 1);
		if (pathname)
			strcpy(pathname, filename);
	}
	else
	{
		pathname = realloc(pathname, len + flen + 2);
		if (pathname)
		{
			strcat(pathname, PATHSEPSTR);
			strcat(pathname, filename);
		}
	}
	return (pathname);
}